

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initkbd.c
# Opt level: O1

void keyboardtype(int fd)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  IFPAGE *pIVar6;
  int iVar7;
  char *__s2;
  u_char *__s;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ushort uVar11;
  DLword DVar12;
  int iVar13;
  int *piVar15;
  int reusable;
  int iVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  int maxkey;
  int minkey;
  int symspercode;
  int lisp_codes_used [256];
  int local_444;
  uint local_440;
  int local_43c;
  int local_438 [258];
  ulong uVar14;
  
  pIVar6 = InterfacePage;
  uVar1 = InterfacePage->devconfig;
  uVar11 = uVar1 & 0xfff8;
  InterfacePage->devconfig = uVar11;
  __s2 = getenv("LDEKBDTYPE");
  uVar17 = 0xe;
  if (__s2 != (char *)0x0) {
    iVar7 = strcmp("as3000j",__s2);
    if (iVar7 == 0) {
      uVar17 = 10;
    }
    else {
      iVar7 = strcmp("type4",__s2);
      if (iVar7 == 0) {
        uVar17 = 4;
      }
      else {
        iVar7 = strcmp("type2",__s2);
        if (iVar7 == 0) {
          uVar17 = 2;
        }
        else {
          iVar7 = strcmp("jle",__s2);
          if (iVar7 == 0) {
            uVar17 = 5;
          }
          else {
            iVar7 = strcmp("X",__s2);
            if ((iVar7 != 0) && (iVar7 = strcmp("x",__s2), iVar7 != 0)) {
              iVar7 = strcmp("sdl",__s2);
              uVar17 = 3;
              if (iVar7 == 0) {
                uVar17 = 0x10;
              }
            }
          }
        }
      }
    }
  }
  switch(uVar17) {
  case 4:
    SUNLispKeyMap = SUNLispKeyMap_for4;
    DVar12 = uVar11 | 1;
    goto LAB_00128012;
  case 5:
    SUNLispKeyMap = SUNLispKeyMap_jle;
    DVar12 = uVar11 | 2;
LAB_00128012:
    pIVar6->devconfig = DVar12;
    break;
  default:
    sprintf((char *)local_438,"Unsupported keyboard type: %d",(ulong)uVar17);
    puts((char *)local_438);
    puts("Configuring keyboard for type-3");
  case 2:
  case 3:
    SUNLispKeyMap = SUNLispKeyMap_for3;
    break;
  case 10:
    SUNLispKeyMap = SUNLispKeyMap_for4;
    pIVar6->devconfig = uVar1 | 7;
    break;
  case 0xe:
    __s = (u_char *)malloc(0x100);
    iVar7 = 0;
    memset(local_438,0,0x400);
    memset(__s,0xff,0x100);
    XDisplayKeycodes(currentdsp->display_id,&local_440,&local_444);
    iVar16 = (local_444 - local_440) + 1;
    auVar18 = XGetKeyboardMapping(currentdsp->display_id,local_440 & 0xff,iVar16,&local_43c);
    uVar10 = auVar18._8_8_;
    uVar17 = iVar16 * local_43c;
    piVar15 = generic_X_keymap;
    iVar16 = -1;
    bVar5 = false;
    do {
      iVar2 = piVar15[2];
      uVar10 = CONCAT71((int7)(uVar10 >> 8),iVar2 == iVar16);
      bVar4 = !bVar5;
      bVar5 = true;
      if (bVar4 || iVar2 != iVar16) {
        iVar3 = piVar15[1];
        uVar14 = 0;
        iVar13 = 0;
        if (0 < (int)uVar17) {
          uVar9 = 0;
          do {
            if (*(long *)(auVar18._0_8_ + uVar9 * 8) == (long)iVar2) {
              uVar8 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
              uVar10 = (long)uVar8 % (long)local_43c & 0xffffffff;
              uVar8 = (long)(int)((long)uVar8 / (long)local_43c) + (long)(int)local_440;
              if (__s[uVar8 - 7] == 0xff) {
                uVar14 = uVar8 & 0xffffffff;
              }
              iVar13 = (int)uVar14;
              if (__s[uVar8 - 7] == 0xff) goto LAB_00127f75;
            }
            uVar9 = uVar9 + 1;
          } while (uVar17 != uVar9);
          iVar13 = 0;
        }
LAB_00127f75:
        iVar16 = iVar2;
        if ((iVar13 == 0) || ((iVar7 == 0 && (local_438[iVar3] != 0)))) {
          bVar5 = false;
        }
        else {
          local_438[iVar3] = 1;
          __s[(long)iVar13 + -7] = (u_char)iVar3;
        }
      }
      piVar15 = piVar15 + 3;
      iVar7 = *piVar15;
    } while (iVar7 != -1);
    XFree(auVar18._0_8_,(long)(int)local_440,uVar10);
    SUNLispKeyMap = __s;
    XGenericKeyMap = __s;
  }
  return;
}

Assistant:

void keyboardtype(int fd)
{
  int type;
  int i;
  char *key;

#if defined(OS4)
  for (i = 0; i < 5000; i++) { /* IDLE LOOP */
  }                            /* because of a SunOS bug */
#endif

  /* clear the keyboard field in devconfig */
  InterfacePage->devconfig &= 0xfff8;

  /************************************************************
   Due to the problems of SunOS 4.0 & 4.0.1
   calling ioctl never return the correct keyboard type.
   So,these 2 lines are commented out ...(Take)->AR11100
  *************************************************************/

  /* Get keytype from LDEKBDTYPE  */
  if ((key = getenv("LDEKBDTYPE")) == 0) {
#ifdef XWINDOW
    type = KB_X;
#elif DOS
    type = KB_DOS;
#elif SDL
    type = KB_SDL;
#endif /* XWINDOW */
  } /* if end */
  else {
    if (strcmp("as3000j", key) == 0)
      type = KB_AS3000J;
    else if (strcmp("type4", key) == 0)
      type = KB_SUN4;
    else if (strcmp("type2", key) == 0)
      type = KB_SUN2;
    else if (strcmp("jle", key) == 0)
      type = KB_JLE;
    else if (strcmp("X", key) == 0 || strcmp("x", key) == 0)
      type = KB_X;
    else if (strcmp("sdl", key) == 0)
      type = KB_SDL;
    else
      type = KB_SUN3; /* default */
  }

  switch (type) {
    case KB_SUN2: /* type2, we still use keymap for type3 */
      SUNLispKeyMap = SUNLispKeyMap_for3;
      /* MIN_KEYTYPE is 3,so we can't set devconfig correctly */
      /* Therefore type2 may treat as type3 */
      InterfacePage->devconfig |= 0;
      break;
    case KB_SUN3: /* type3 */
      SUNLispKeyMap = SUNLispKeyMap_for3;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      break;
    case KB_SUN4: /* type4 */
      SUNLispKeyMap = SUNLispKeyMap_for4;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      break;
    case KB_JLE: /* JLE */
      /*printf("jle\n"); */
      SUNLispKeyMap = SUNLispKeyMap_jle;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      /* InterfacePage->devconfig |= 4-MIN_KEYTYPE; */
      break;
    case KB_AS3000J: /* for AS, use type4 map */
      SUNLispKeyMap = SUNLispKeyMap_for4;
      InterfacePage->devconfig |= type - MIN_KEYTYPE; /* 7 */
      break;
#ifdef XWINDOW
    case KB_X:
      XGenericKeyMap = (u_char *)make_X_keymap();
      SUNLispKeyMap = XGenericKeyMap;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
      break;
#endif /* XWINDOW */
#ifdef SDL
  case KB_SDL:
    InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
    break;
#endif /* SDL */
#ifdef DOS
    case KB_DOS:
      SUNLispKeyMap = DOSLispKeyMap_101;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
      break;
#endif /* DOS */
    default: {
      char errmsg[200];
      sprintf(errmsg, "Unsupported keyboard type: %d", type);
      printf("%s\n", errmsg);
      printf("Configuring keyboard for type-3\n");
      SUNLispKeyMap = SUNLispKeyMap_for3;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE;
      break;
    }
  }

}